

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Exception::Exception(Exception *this,string *msg)

{
  string *msg_local;
  Exception *this_local;
  
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__Exception_00ad0a50;
  std::__cxx11::string::string((string *)&this->msg_,(string *)msg);
  return;
}

Assistant:

Exception::Exception(JSONCPP_STRING const& msg)
  : msg_(msg)
{}